

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tables.cpp
# Opt level: O0

int __thiscall CFunctionTable::Insert(CFunctionTable *this,char *name_cstr,function_fn_t nfunp)

{
  bool bVar1;
  int iVar2;
  type *ptVar3;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)()>_>,_bool>
  pVar4;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)()>_>,_bool>
  local_b8;
  reference local_a8;
  char *c;
  iterator __end1;
  iterator __begin1;
  string *__range1;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)()>_>,_bool>
  local_70 [2];
  allocator<char> local_49;
  undefined1 local_48 [8];
  string name;
  function_fn_t nfunp_local;
  char *name_cstr_local;
  CFunctionTable *this_local;
  
  name.field_2._8_8_ = nfunp;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_48,name_cstr,&local_49);
  std::allocator<char>::~allocator(&local_49);
  pVar4 = std::
          map<std::__cxx11::string,void(*)(),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)()>>>
          ::emplace<std::__cxx11::string&,void(*&)()>
                    ((map<std::__cxx11::string,void(*)(),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)()>>>
                      *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_48,(_func_void **)((long)&name.field_2 + 8));
  local_70[0].first = pVar4.first._M_node;
  local_70[0].second = pVar4.second;
  ptVar3 = std::
           get<1ul,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,void(*)()>>,bool>
                     (local_70);
  if (((*ptVar3 ^ 0xffU) & 1) == 0) {
    __end1._M_current = (char *)std::__cxx11::string::begin();
    c = (char *)std::__cxx11::string::end();
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&c);
      if (!bVar1) break;
      local_a8 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&__end1);
      iVar2 = toupper((int)*local_a8);
      *local_a8 = (char)iVar2;
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end1);
    }
    pVar4 = std::
            map<std::__cxx11::string,void(*)(),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)()>>>
            ::emplace<std::__cxx11::string&,void(*&)()>
                      ((map<std::__cxx11::string,void(*)(),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)()>>>
                        *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_48,(_func_void **)((long)&name.field_2 + 8));
    local_b8.first = pVar4.first._M_node;
    local_b8.second = pVar4.second;
    ptVar3 = std::
             get<1ul,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,void(*)()>>,bool>
                       (&local_b8);
    this_local._4_4_ = (uint)(*ptVar3 & 1);
  }
  else {
    this_local._4_4_ = 0;
  }
  std::__cxx11::string::~string((string *)local_48);
  return this_local._4_4_;
}

Assistant:

int CFunctionTable::Insert(const char* name_cstr, function_fn_t nfunp) {
	std::string name(name_cstr);
	if (!std::get<1>(functions.emplace(name, nfunp))) return 0;
	for (auto& c : name) c = toupper(c);
	return std::get<1>(functions.emplace(name, nfunp));
}